

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O2

double __thiscall IF97::BaseRegion::cvmass(BaseRegion *this,double T,double p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  
  dVar1 = this->T_star;
  auVar7._8_4_ = SUB84(this->p_star,0);
  auVar7._0_8_ = T;
  auVar7._12_4_ = (int)((ulong)this->p_star >> 0x20);
  dVar3 = cpmass(this,T,p);
  dVar2 = this->R;
  dVar4 = dgammar_dPI(this,T,p);
  dVar5 = d2gammar_dPIdTAU(this,T,p);
  auVar6._0_8_ = -dVar1;
  auVar6._8_8_ = p;
  auVar7 = divpd(auVar6,auVar7);
  dVar8 = auVar7._8_8_;
  dVar1 = powi(dVar5 * auVar7._0_8_ * dVar8 + dVar4 * dVar8 + 1.0,2);
  dVar4 = d2gammar_dPI2(this,T,p);
  return dVar3 - (dVar1 * dVar2) / (1.0 - dVar8 * dVar8 * dVar4);
}

Assistant:

virtual double cvmass(double T, double p) const{
            const double tau = T_star/T, PI = p/p_star;
            return cpmass(T,p)-R*powi(1 + PI*dgammar_dPI(T,p) - tau*PI*d2gammar_dPIdTAU(T,p),2)/(1-PI*PI*d2gammar_dPI2(T, p));
        }